

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O0

int SDL_GL_SetAttribute(SDL12_GLattr attr,int value)

{
  int value_local;
  SDL12_GLattr attr_local;
  
  if (attr < SDL12_GL_MAX_ATTRIBUTE) {
    if (attr == SDL12_GL_SWAP_CONTROL) {
      value_local = 0;
      SwapInterval = value;
    }
    else if (attr == SDL12_GL_MULTISAMPLESAMPLES) {
      value_local = 0;
      OpenGLLogicalScalingSamples = value;
    }
    else if (attr == SDL12_GL_MULTISAMPLEBUFFERS) {
      value_local = 0;
    }
    else {
      value_local = (*SDL20_GL_SetAttribute)(attr,value);
    }
  }
  else {
    value_local = (*SDL20_SetError)("Unknown GL attribute");
  }
  return value_local;
}

Assistant:

SDLCALL
SDL_GL_SetAttribute(SDL12_GLattr attr, int value)
{
    if (attr >= SDL12_GL_MAX_ATTRIBUTE) {
        return SDL20_SetError("Unknown GL attribute");
    }

    /* swap control was moved out of this API, everything else lines up. */
    if (attr == SDL12_GL_SWAP_CONTROL) {
        SwapInterval = value;
        return 0;
    }
    if (attr == SDL12_GL_MULTISAMPLESAMPLES) {
        OpenGLLogicalScalingSamples = value;
        return 0;
    }
    if (attr == SDL12_GL_MULTISAMPLEBUFFERS) {
        return 0;
    }
    return SDL20_GL_SetAttribute((SDL_GLattr) attr, value);
}